

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

cmInstallTargetGenerator *
CreateInstallTargetGenerator
          (cmTarget *target,cmInstallCommandArguments *args,bool impLib,
          cmListFileBacktrace *backtrace,string *destination,bool forceOpt,bool namelink)

{
  char *component;
  char *dest;
  char *file_permissions;
  bool exclude_from_all;
  bool bVar1;
  MessageLevel message;
  string *psVar2;
  cmInstallTargetGenerator *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  
  message = cmInstallGenerator::SelectMessageLevel(target->Makefile,false);
  target->HaveInstallRule = true;
  if (namelink) {
    psVar2 = cmInstallCommandArguments::GetNamelinkComponent_abi_cxx11_(args);
  }
  else {
    psVar2 = cmInstallCommandArguments::GetComponent_abi_cxx11_(args);
  }
  component = (psVar2->_M_dataplus)._M_p;
  this = (cmInstallTargetGenerator *)operator_new(0x118);
  std::__cxx11::string::string((string *)&local_50,(string *)&target->Name);
  dest = (destination->_M_dataplus)._M_p;
  psVar2 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(args);
  file_permissions = (psVar2->_M_dataplus)._M_p;
  configurations = cmInstallCommandArguments::GetConfigurations_abi_cxx11_(args);
  exclude_from_all = cmInstallCommandArguments::GetExcludeFromAll(args);
  bVar1 = cmInstallCommandArguments::GetOptional(args);
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,
             (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)backtrace
            );
  cmInstallTargetGenerator::cmInstallTargetGenerator
            (this,&local_50,dest,impLib,file_permissions,configurations,component,message,
             exclude_from_all,bVar1 || forceOpt,(cmListFileBacktrace *)&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  std::__cxx11::string::~string((string *)&local_50);
  return this;
}

Assistant:

static cmInstallTargetGenerator* CreateInstallTargetGenerator(
  cmTarget& target, const cmInstallCommandArguments& args, bool impLib,
  cmListFileBacktrace const& backtrace, const std::string& destination,
  bool forceOpt = false, bool namelink = false)
{
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(target.GetMakefile());
  target.SetHaveInstallRule(true);
  const char* component = namelink ? args.GetNamelinkComponent().c_str()
                                   : args.GetComponent().c_str();
  return new cmInstallTargetGenerator(
    target.GetName(), destination.c_str(), impLib,
    args.GetPermissions().c_str(), args.GetConfigurations(), component,
    message, args.GetExcludeFromAll(), args.GetOptional() || forceOpt,
    backtrace);
}